

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

nullres nullcTestEvaluateExpressionTree(char *resultBuf,uint resultBufSize)

{
  bool bVar1;
  int iVar2;
  nullres nVar3;
  TraceScope traceScope;
  TraceScope local_20;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    return '\0';
  }
  if ((nullcTestEvaluateExpressionTree::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&nullcTestEvaluateExpressionTree::token), iVar2 != 0)) {
    nullcTestEvaluateExpressionTree::token =
         NULLC::TraceGetToken("nullc","nullcTestEvaluateExpressionTree");
    __cxa_guard_release(&nullcTestEvaluateExpressionTree::token);
  }
  NULLC::TraceScope::TraceScope(&local_20,nullcTestEvaluateExpressionTree::token);
  if (NULLC::compilerCtx == 0) {
    NULLC::nullcLastError = "ERROR: there is no active compiler context";
  }
  else {
    bVar1 = TestEvaluation((ExpressionContext *)(NULLC::compilerCtx + 0x18b8),
                           *(ExprBase **)(NULLC::compilerCtx + 0xa310),resultBuf,resultBufSize,
                           *(char **)(NULLC::compilerCtx + 0x20),
                           *(uint *)(NULLC::compilerCtx + 0x28));
    nVar3 = '\x01';
    if (bVar1) goto LAB_0010f583;
    NULLC::nullcLastError = *(char **)(NULLC::compilerCtx + 0x20);
  }
  nVar3 = '\0';
LAB_0010f583:
  NULLC::TraceScope::~TraceScope(&local_20);
  return nVar3;
}

Assistant:

nullres nullcTestEvaluateExpressionTree(char *resultBuf, unsigned resultBufSize)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcTestEvaluateExpressionTree");

	if(!compilerCtx)
	{
		nullcLastError = "ERROR: there is no active compiler context";
		return 0;
	}

	if(!TestEvaluation(compilerCtx->exprCtx, compilerCtx->exprModule, resultBuf, resultBufSize, compilerCtx->errorBuf, compilerCtx->errorBufSize))
	{
		nullcLastError = compilerCtx->errorBuf;
		return false;
	}

	return true;
}